

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O3

sc_signed * sc_dt::operator^(sc_signed *__return_storage_ptr__,sc_unsigned *u,sc_signed *v)

{
  if (v->sgn == 0) {
    sc_signed::sc_signed(__return_storage_ptr__,u);
  }
  else if (u->sgn == 0) {
    sc_signed::sc_signed(__return_storage_ptr__,v);
  }
  else {
    xor_signed_friend(__return_storage_ptr__,u->sgn,u->nbits,u->ndigits,u->digit,v->sgn,v->nbits,
                      v->ndigits,v->digit);
  }
  return __return_storage_ptr__;
}

Assistant:

sc_signed
operator^(const sc_unsigned& u, const sc_signed& v)
{

  if (v.sgn == SC_ZERO)  // case 1
    return sc_signed(u);

  if (u.sgn == SC_ZERO)  // case 2
    return sc_signed(v);

  // other cases
  return xor_signed_friend(u.sgn, u.nbits, u.ndigits, u.digit,
                           v.sgn, v.nbits, v.ndigits, v.digit);

}